

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_allocation.c
# Opt level: O0

PaUtilAllocationGroup * PaUtil_CreateAllocationGroup(void)

{
  PaUtilAllocationGroupLink *size;
  long unaff_retaddr;
  PaUtilAllocationGroupLink *links;
  PaUtilAllocationGroup *result;
  PaUtilAllocationGroupLink *in_stack_fffffffffffffff0;
  PaUtilAllocationGroup *pPVar1;
  
  pPVar1 = (PaUtilAllocationGroup *)0x0;
  size = AllocateLinks(unaff_retaddr,(PaUtilAllocationGroupLink *)0x0,in_stack_fffffffffffffff0);
  if (size != (PaUtilAllocationGroupLink *)0x0) {
    pPVar1 = (PaUtilAllocationGroup *)PaUtil_AllocateMemory((long)size);
    if (pPVar1 == (PaUtilAllocationGroup *)0x0) {
      PaUtil_FreeMemory((void *)0x1078f7);
    }
    else {
      pPVar1->linkCount = 0x10;
      pPVar1->linkBlocks = size;
      pPVar1->spareLinks = size + 1;
      pPVar1->allocations = (PaUtilAllocationGroupLink *)0x0;
    }
  }
  return pPVar1;
}

Assistant:

PaUtilAllocationGroup* PaUtil_CreateAllocationGroup( void )
{
    PaUtilAllocationGroup* result = 0;
    struct PaUtilAllocationGroupLink *links;


    links = AllocateLinks( PA_INITIAL_LINK_COUNT_, 0, 0 );
    if( links != 0 )
    {
        result = (PaUtilAllocationGroup*)PaUtil_AllocateMemory( sizeof(PaUtilAllocationGroup) );
        if( result )
        {
            result->linkCount = PA_INITIAL_LINK_COUNT_;
            result->linkBlocks = &links[0];
            result->spareLinks = &links[1];
            result->allocations = 0;
        }
        else
        {
            PaUtil_FreeMemory( links );
        }
    }

    return result;
}